

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::verifyLookupTextureData
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  pointer *this_00;
  glUseProgramFunc p_Var1;
  undefined *puVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  deUint32 dVar6;
  ostream *poVar7;
  TestError *this_01;
  uchar *ptr;
  GLchar *pGVar8;
  char *pcVar9;
  RenderContext *renderCtx;
  ShaderInfo *pSVar10;
  ProgramInfo *pPVar11;
  GLubyte *outDataRegion;
  GLubyte *dataRegion;
  GLint x;
  GLint y;
  ShaderProgram program;
  string local_688;
  allocator<char> local_661;
  string local_660;
  undefined1 local_640 [8];
  ProgramSources sources;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  undefined1 local_4d0 [8];
  TokenStringsExt s;
  undefined1 local_190 [8];
  string functionDef;
  undefined1 local_168 [8];
  string fragment;
  undefined1 local_140 [8];
  string vertex;
  int local_118;
  int sample;
  GLint z;
  GLuint fbo;
  GLuint verifyTexture;
  GLint verifyTarget;
  FunctionToken f;
  GLubyte *out_data;
  GLubyte *exp_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  GLint texSize;
  GLuint GStack_4c;
  bool result;
  GLint depth;
  GLint height;
  GLint width;
  GLint local_34;
  GLuint *pGStack_30;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureClampLookupColorTestCase *this_local;
  
  local_34 = level;
  pGStack_30 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar7 = std::operator<<((ostream *)
                           &(this->super_SparseTextureClampLookupResidencyTestCase).
                            super_SparseTexture2LookupTestCase.
                            super_SparseTexture2CommitmentTestCase.
                            super_SparseTextureCommitmentTestCase.field_0x88,
                           "Verify Lookup Color Texture Data [function: ");
  poVar7 = std::operator<<(poVar7,(string *)funcToken);
  poVar7 = std::operator<<(poVar7,", level: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_34);
  std::operator<<(poVar7,"] - ");
  if (local_34 <=
      (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.levels +
      -1) {
    SparseTextureUtils::getTextureLevelSize
              (texture_local._4_4_,
               &(this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mState,local_34,&depth,
               (GLint *)&stack0xffffffffffffffb4,&texSize);
    if (((depth == 0) || (GStack_4c == 0)) ||
       (texSize < (this->super_SparseTextureClampLookupResidencyTestCase).
                  super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                  super_SparseTextureCommitmentTestCase.mState.minDepth)) {
      this_local._7_1_ = 1;
    }
    else {
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      if (texture_local._4_4_ == 0x8513) {
        texSize = texSize * 6;
      }
      iVar4 = depth * GStack_4c;
      this_00 = &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(long)iVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data,(long)iVar4);
      ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      ::deMemset(ptr,0xff,(long)iVar4);
      SparseTexture2LookupTestCase::FunctionToken::FunctionToken
                ((FunctionToken *)&verifyTexture,funcToken);
      fbo = 0xde1;
      gl4cts::Texture::Generate(_format_local,(GLuint *)&z);
      gl4cts::Texture::Bind(_format_local,z,fbo);
      gl4cts::Texture::Storage(_format_local,fbo,1,0x8229,depth,GStack_4c,texSize);
      GVar5 = (*_format_local->getError)();
      glu::checkError(GVar5,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x32e);
      (*_format_local->genFramebuffers)(1,(GLuint *)&sample);
      GVar5 = (*_format_local->getError)();
      glu::checkError(GVar5,"glGenFramebuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x332);
      (*_format_local->bindFramebuffer)(0x8d40,sample);
      GVar5 = (*_format_local->getError)();
      glu::checkError(GVar5,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x334);
      (*_format_local->framebufferTexture2D)(0x8d40,0x8ce0,fbo,z,0);
      GVar5 = (*_format_local->getError)();
      glu::checkError(GVar5,"glFramebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x336);
      (*_format_local->viewport)(0,0,depth,GStack_4c);
      for (local_118 = 0; local_118 < texSize; local_118 = local_118 + 1) {
        for (vertex.field_2._12_4_ = 0;
            (int)vertex.field_2._12_4_ <
            (this->super_SparseTextureClampLookupResidencyTestCase).
            super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.mState.samples;
            vertex.field_2._12_4_ = vertex.field_2._12_4_ + 1) {
          ::deMemset((void *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
                     (long)iVar4);
          gl4cts::Texture::Bind(_format_local,z,fbo);
          gl4cts::Texture::SubImage
                    (_format_local,fbo,0,0,0,0,depth,GStack_4c,0,0x1903,0x1401,
                     (GLvoid *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x343);
          puVar2 = stc_vertex_common;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_140,puVar2,
                     (allocator<char> *)(fragment.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(fragment.field_2._M_local_buf + 0xf))
          ;
          puVar2 = stc_fragment_lookupColor;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_168,puVar2,
                     (allocator<char> *)(functionDef.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(functionDef.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string
                    ((string *)(s.pointCoord.field_2._M_local_buf + 8),(string *)&verifyTexture);
          generateFunctionDef((string *)local_190,this,(string *)((long)&s.pointCoord.field_2 + 8));
          std::__cxx11::string::~string((string *)(s.pointCoord.field_2._M_local_buf + 8));
          SparseTexture2LookupTestCase::createLookupShaderTokens
                    ((TokenStringsExt *)local_4d0,(SparseTexture2LookupTestCase *)this,
                     texture_local._4_4_,(GLint)texture_local,local_34,vertex.field_2._12_4_,
                     (FunctionToken *)&verifyTexture);
          std::__cxx11::string::string
                    ((string *)&local_510,
                     (string *)(s.super_TokenStrings.inputType.field_2._M_local_buf + 8));
          generateExpectedResult(&local_4f0,this,&local_510,local_34);
          std::__cxx11::string::operator=
                    ((string *)(s.super_TokenStrings.returnType.field_2._M_local_buf + 8),
                     (string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_510);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COORD_TYPE>",pGVar8,(string *)local_140);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<FUNCTION_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<FUNCTION>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<ARGUMENTS>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OUTPUT_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<INPUT_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<SIZE_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<LOD>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<LOD_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COORD_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<ICOORD_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COORD_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<RETURN_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<RESULT_EXPECTED>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<EPSILON>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<SAMPLE_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<REFZ_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_COORD>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COMPONENT_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<CUBE_MAP_COORD_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OFFSET_ARRAY_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<FORMAT_DEF>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OFFSET_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<NOFFSET_TYPE>",pGVar8,(string *)local_168);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OFFSET_DIM>",pGVar8,(string *)local_168);
          de::toString<int>(&local_530,&depth);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<TEX_WIDTH>",pGVar8,(string *)local_168);
          std::__cxx11::string::~string((string *)&local_530);
          de::toString<int>(&local_550,(int *)&stack0xffffffffffffffb4);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<TEX_HEIGHT>",pGVar8,(string *)local_168);
          std::__cxx11::string::~string((string *)&local_550);
          de::toString<int>((string *)&sources.separable,&texSize);
          pGVar8 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<TEX_DEPTH>",pGVar8,(string *)local_168);
          std::__cxx11::string::~string((string *)&sources.separable);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,pcVar9,&local_661)
          ;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_688,pcVar9,
                     (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
          glu::makeVtxFragSources((ProgramSources *)local_640,&local_660,&local_688);
          std::__cxx11::string::~string((string *)&local_688);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
          std::__cxx11::string::~string((string *)&local_660);
          std::allocator<char>::~allocator(&local_661);
          renderCtx = deqp::Context::getRenderContext
                                ((this->super_SparseTextureClampLookupResidencyTestCase).
                                 super_SparseTexture2LookupTestCase.
                                 super_SparseTexture2CommitmentTestCase.
                                 super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
          glu::ShaderProgram::ShaderProgram
                    ((ShaderProgram *)&x,renderCtx,(ProgramSources *)local_640);
          bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)&x);
          if (bVar3) {
            p_Var1 = _format_local->useProgram;
            dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)&x);
            (*p_Var1)(dVar6);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x379);
            (*_format_local->activeTexture)(0x84c0);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glActiveTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x37d);
            (*_format_local->uniform1i)(1,0);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x37f);
            (*_format_local->bindTexture)(texture_local._4_4_,*pGStack_30);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"glBindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x382);
            (*_format_local->clear)(0x4100);
            (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                   super_SparseTexture2LookupTestCase.
                                   super_SparseTexture2CommitmentTestCase.
                                   super_SparseTextureCommitmentTestCase.super_TestCase.
                                   super_TestCase.super_TestNode + 0xa0))
                      (this,texture_local._4_4_,local_118,&x);
            gl4cts::Texture::Bind(_format_local,z,fbo);
            gl4cts::Texture::GetData
                      (_format_local,0,fbo,0x1903,0x1401,
                       (GLvoid *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
            GVar5 = (*_format_local->getError)();
            glu::checkError(GVar5,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x389);
            for (dataRegion._4_4_ = 0; dataRegion._4_4_ < (int)GStack_4c;
                dataRegion._4_4_ = dataRegion._4_4_ + 1) {
              for (dataRegion._0_4_ = 0; (int)dataRegion < depth;
                  dataRegion._0_4_ = (int)dataRegion + 1) {
                if (ptr[(long)(dataRegion._4_4_ * depth) + (long)(int)dataRegion] !=
                    *(uchar *)(f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               (long)(int)dataRegion + (long)(dataRegion._4_4_ * depth))) {
                  vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                }
              }
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)
                                     &(this->super_SparseTextureClampLookupResidencyTestCase).
                                      super_SparseTexture2LookupTestCase.
                                      super_SparseTexture2CommitmentTestCase.
                                      super_SparseTextureCommitmentTestCase.field_0x88,
                                     "Shader compilation failed (lookup color) for target: ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,texture_local._4_4_);
            poVar7 = std::operator<<(poVar7,", format: ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,(GLint)texture_local);
            poVar7 = std::operator<<(poVar7,", vertexInfoLog: ");
            pSVar10 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)&x,SHADERTYPE_VERTEX,0);
            poVar7 = std::operator<<(poVar7,(string *)&pSVar10->infoLog);
            poVar7 = std::operator<<(poVar7,", fragmentInfoLog: ");
            pSVar10 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)&x,SHADERTYPE_FRAGMENT,0);
            poVar7 = std::operator<<(poVar7,(string *)&pSVar10->infoLog);
            poVar7 = std::operator<<(poVar7,", programInfoLog: ");
            pPVar11 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)&x);
            poVar7 = std::operator<<(poVar7,(string *)pPVar11);
            poVar7 = std::operator<<(poVar7,", fragmentSource: ");
            pcVar9 = (char *)std::__cxx11::string::c_str();
            poVar7 = std::operator<<(poVar7,pcVar9);
            std::operator<<(poVar7," - ");
            vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          }
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&x);
          glu::ProgramSources::~ProgramSources((ProgramSources *)local_640);
          SparseTexture2LookupTestCase::TokenStringsExt::~TokenStringsExt
                    ((TokenStringsExt *)local_4d0);
          std::__cxx11::string::~string((string *)local_190);
          std::__cxx11::string::~string((string *)local_168);
          std::__cxx11::string::~string((string *)local_140);
        }
      }
      (*_format_local->bindFramebuffer)(0x8d40,0);
      GVar5 = (*_format_local->getError)();
      glu::checkError(GVar5,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x3a3);
      gl4cts::Texture::Delete(_format_local,(GLuint *)&z);
      this_local._7_1_ =
           vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_;
      SparseTexture2LookupTestCase::FunctionToken::~FunctionToken((FunctionToken *)&verifyTexture);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    return (bool)(this_local._7_1_ & 1);
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
             ,0x30a);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool SparseTextureClampLookupColorTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
																	GLuint& texture, GLint level,
																	FunctionToken& funcToken)
{
	mLog << "Verify Lookup Color Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint  verifyTarget = GL_TEXTURE_2D;
	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, verifyTarget, verifyTexture, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D");

	gl.viewport(0, 0, width, height);

	for (GLint z = 0; z < depth; ++z)
	{
		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, 0, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string vertex   = stc_vertex_common;
			std::string fragment = stc_fragment_lookupColor;

			std::string functionDef = generateFunctionDef(f.name);

			// Adjust shader source to texture format
			TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

			// Change expected result as it has to be adjusted to different levels
			s.resultExpected = generateExpectedResult(s.returnType, level);

			replaceToken("<COORD_TYPE>", s.coordType.c_str(), vertex);

			replaceToken("<FUNCTION_DEF>", functionDef.c_str(), fragment);
			replaceToken("<FUNCTION>", f.name.c_str(), fragment);
			replaceToken("<ARGUMENTS>", f.arguments.c_str(), fragment);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), fragment);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), fragment);
			replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), fragment);
			replaceToken("<LOD>", s.lod.c_str(), fragment);
			replaceToken("<LOD_DEF>", s.lodDef.c_str(), fragment);
			replaceToken("<COORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<ICOORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<COORD_DEF>", s.coordDef.c_str(), fragment);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), fragment);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), fragment);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), fragment);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), fragment);
			replaceToken("<EPSILON>", s.epsilon.c_str(), fragment);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), fragment);
			replaceToken("<REFZ_DEF>", s.refZDef.c_str(), fragment);
			replaceToken("<POINT_COORD>", s.pointCoord.c_str(), fragment);
			replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), fragment);
			replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), fragment);
			replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), fragment);
			replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), fragment);
			replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), fragment);
			replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), fragment);
			replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), fragment);

			replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), fragment);
			replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), fragment);
			replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), fragment);

			ProgramSources sources = makeVtxFragSources(vertex.c_str(), fragment.c_str());

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

				// Pass input sampler/image to shader
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.uniform1i(1, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				draw(target, z, program);

				Texture::Bind(gl, verifyTexture, verifyTarget);
				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width;
						GLubyte* outDataRegion = out_data + x + y * width;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
			}
			else
			{
				mLog << "Shader compilation failed (lookup color) for target: " << target << ", format: " << format
					 << ", vertexInfoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
					 << ", fragmentInfoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
					 << ", programInfoLog: " << program.getProgramInfo().infoLog
					 << ", fragmentSource: " << fragment.c_str() << " - ";

				result = false;
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");

	Texture::Delete(gl, verifyTexture);

	return result;
}